

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PromiseReceive.h
# Opt level: O0

void brynet::net::memsearch
               (char *hay,size_t haysize,char *needle,size_t needlesize,size_t *result,bool *isOK)

{
  ulong local_48;
  size_t needlepos;
  size_t haypos;
  bool *isOK_local;
  size_t *result_local;
  size_t needlesize_local;
  char *needle_local;
  size_t haysize_local;
  char *hay_local;
  
  needlepos = 0;
  while( true ) {
    if (haysize - needlesize < needlepos) {
      *isOK = false;
      return;
    }
    for (local_48 = 0; (local_48 < needlesize && (hay[needlepos + local_48] == needle[local_48]));
        local_48 = local_48 + 1) {
    }
    if (local_48 == needlesize) break;
    needlepos = needlepos + 1;
  }
  *result = needlepos;
  *isOK = true;
  return;
}

Assistant:

void memsearch(const char *hay, size_t haysize, const char *needle, size_t needlesize, size_t& result, bool& isOK)
        {
            size_t haypos, needlepos;
            haysize -= needlesize;

            for (haypos = 0; haypos <= haysize; haypos++)
            {
                for (needlepos = 0; needlepos < needlesize; needlepos++)
                {
                    if (hay[haypos + needlepos] != needle[needlepos])
                    {
                        // Next character in haystack.
                        break;
                    }
                }
                if (needlepos == needlesize)
                {
                    result = haypos;
                    isOK = true;
                    return;
                }
            }

            isOK = false;
        }